

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_element(SQRex *exp)

{
  char cVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  SQRex *exp_00;
  SQInteger SVar6;
  long in_RDI;
  SQInteger nnode_1;
  SQInteger nnode;
  unsigned_short p1;
  unsigned_short p0;
  SQBool isgreedy;
  SQInteger newn;
  SQInteger expr;
  SQInteger ret;
  SQChar *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQRex *in_stack_ffffffffffffffc0;
  SQRex *in_stack_ffffffffffffffc8;
  undefined4 local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  SQRexNodeType type;
  SQRex *in_stack_ffffffffffffffe0;
  SQRex *local_18;
  
  type = (SQRexNodeType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  cVar1 = **(char **)(in_RDI + 0x10);
  if (cVar1 == '$') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_18 = (SQRex *)sqstd_rex_newnode(in_stack_ffffffffffffffe0,type);
  }
  else if (cVar1 == '(') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    if (**(char **)(in_RDI + 0x10) == '?') {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      sqstd_rex_expect((SQRex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (SQInteger)in_stack_ffffffffffffffa8);
      local_18 = (SQRex *)sqstd_rex_newnode(in_stack_ffffffffffffffe0,type);
    }
    else {
      local_18 = (SQRex *)sqstd_rex_newnode(in_stack_ffffffffffffffe0,type);
    }
    in_stack_ffffffffffffffe0 = (SQRex *)sqstd_rex_list(in_stack_ffffffffffffffc0);
    *(SQRex **)(*(long *)(in_RDI + 0x28) + (long)local_18 * 0x20 + 8) = in_stack_ffffffffffffffe0;
    sqstd_rex_expect((SQRex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (SQInteger)in_stack_ffffffffffffffa8);
  }
  else if (cVar1 == '.') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_18 = (SQRex *)sqstd_rex_newnode(in_stack_ffffffffffffffe0,type);
  }
  else if (cVar1 == '[') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_18 = (SQRex *)sqstd_rex_class(in_stack_ffffffffffffffe0);
    sqstd_rex_expect((SQRex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (SQInteger)in_stack_ffffffffffffffa8);
  }
  else {
    local_18 = (SQRex *)sqstd_rex_charnode(in_stack_ffffffffffffffc8,
                                           (SQBool)in_stack_ffffffffffffffc0);
  }
  bVar2 = false;
  local_2c = 0;
  cVar1 = **(char **)(in_RDI + 0x10);
  if (cVar1 == '*') {
    local_2c = 0xffff;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    bVar2 = true;
  }
  else if (cVar1 == '+') {
    local_2c = 0x1ffff;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    bVar2 = true;
  }
  else if (cVar1 == '?') {
    local_2c = 1;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    bVar2 = true;
  }
  else if (cVar1 == '{') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    iVar4 = isdigit((int)**(char **)(in_RDI + 0x10));
    if (iVar4 == 0) {
      sqstd_rex_error((SQRex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
    }
    SVar6 = sqstd_rex_parsenumber
                      ((SQRex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    uVar3 = (ushort)SVar6;
    local_2c = (uint)uVar3 << 0x10;
    iVar4 = (int)**(char **)(in_RDI + 0x10);
    if (iVar4 == 0x2c) {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      local_2c = CONCAT22(uVar3,0xffff);
      iVar5 = isdigit((int)**(char **)(in_RDI + 0x10));
      if (iVar5 != 0) {
        SVar6 = sqstd_rex_parsenumber((SQRex *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
        local_2c = CONCAT22(uVar3,(short)SVar6);
      }
      sqstd_rex_expect((SQRex *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                       (SQInteger)in_stack_ffffffffffffffa8);
    }
    else if (iVar4 == 0x7d) {
      local_2c = CONCAT22(uVar3,uVar3);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
    else {
      sqstd_rex_error((SQRex *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
    }
    bVar2 = true;
  }
  exp_00 = local_18;
  if (bVar2) {
    exp_00 = (SQRex *)sqstd_rex_newnode(in_stack_ffffffffffffffe0,0);
    *(SQRex **)(*(long *)(in_RDI + 0x28) + (long)exp_00 * 0x20 + 8) = local_18;
    *(long *)(*(long *)(in_RDI + 0x28) + (long)exp_00 * 0x20 + 0x10) = (long)local_2c;
  }
  if ((((**(char **)(in_RDI + 0x10) != '|') && (**(char **)(in_RDI + 0x10) != ')')) &&
      (**(char **)(in_RDI + 0x10) != '*')) &&
     ((**(char **)(in_RDI + 0x10) != '+' && (**(char **)(in_RDI + 0x10) != '\0')))) {
    SVar6 = sqstd_rex_element(exp_00);
    *(SQInteger *)(*(long *)(in_RDI + 0x28) + (long)exp_00 * 0x20 + 0x18) = SVar6;
  }
  return (SQInteger)exp_00;
}

Assistant:

static SQInteger sqstd_rex_element(SQRex *exp)
{
    SQInteger ret = -1;
    switch(*exp->_p)
    {
    case '(': {
        SQInteger expr;
        exp->_p++;


        if(*exp->_p =='?') {
            exp->_p++;
            sqstd_rex_expect(exp,':');
            expr = sqstd_rex_newnode(exp,OP_NOCAPEXPR);
        }
        else
            expr = sqstd_rex_newnode(exp,OP_EXPR);
        SQInteger newn = sqstd_rex_list(exp);
        exp->_nodes[expr].left = newn;
        ret = expr;
        sqstd_rex_expect(exp,')');
              }
              break;
    case '[':
        exp->_p++;
        ret = sqstd_rex_class(exp);
        sqstd_rex_expect(exp,']');
        break;
    case SQREX_SYMBOL_END_OF_STRING: exp->_p++; ret = sqstd_rex_newnode(exp,OP_EOL);break;
    case SQREX_SYMBOL_ANY_CHAR: exp->_p++; ret = sqstd_rex_newnode(exp,OP_DOT);break;
    default:
        ret = sqstd_rex_charnode(exp,SQFalse);
        break;
    }


    SQBool isgreedy = SQFalse;
    unsigned short p0 = 0, p1 = 0;
    switch(*exp->_p){
        case SQREX_SYMBOL_GREEDY_ZERO_OR_MORE: p0 = 0; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ONE_OR_MORE: p0 = 1; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ZERO_OR_ONE: p0 = 0; p1 = 1; exp->_p++; isgreedy = SQTrue; break;
        case '{':
            exp->_p++;
            if(!isdigit(*exp->_p)) sqstd_rex_error(exp,_SC("number expected"));
            p0 = (unsigned short)sqstd_rex_parsenumber(exp);
            /*******************************/
            switch(*exp->_p) {
        case '}':
            p1 = p0; exp->_p++;
            break;
        case ',':
            exp->_p++;
            p1 = 0xFFFF;
            if(isdigit(*exp->_p)){
                p1 = (unsigned short)sqstd_rex_parsenumber(exp);
            }
            sqstd_rex_expect(exp,'}');
            break;
        default:
            sqstd_rex_error(exp,_SC(", or } expected"));
            }
            /*******************************/
            isgreedy = SQTrue;
            break;

    }
    if(isgreedy) {
        SQInteger nnode = sqstd_rex_newnode(exp,OP_GREEDY);
        exp->_nodes[nnode].left = ret;
        exp->_nodes[nnode].right = ((p0)<<16)|p1;
        ret = nnode;
    }

    if((*exp->_p != SQREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != SQREX_SYMBOL_GREEDY_ZERO_OR_MORE) && (*exp->_p != SQREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        SQInteger nnode = sqstd_rex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}